

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_dictionary.hpp
# Opt level: O0

bool pd::prepareData(string *dir_name,string *data_filename,string *dict_filename,
                    uint32_t num_dimensions)

{
  bool bVar1;
  byte bVar2;
  type this;
  string *psVar3;
  istream *piVar4;
  pointer pvVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  pointer ppVar8;
  ostream *poVar9;
  byte local_662;
  byte local_614;
  path local_600;
  string local_5e0;
  iterator local_5c0;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_> local_5b8;
  iterator local_5b0;
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_> local_5a8;
  const_iterator it_2;
  uint32_t i;
  uint32_t key;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_590;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_588;
  const_iterator it_1;
  undefined1 local_578 [7];
  hash<unsigned_int> uint32_hash;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  result;
  string line;
  ifstream fi;
  path local_320;
  path *local_300;
  path *p;
  bool _foreach_continue48;
  auto_any_base *local_2e8;
  auto_any_t _foreach_end48;
  auto_any_base *local_2d8;
  auto_any_t _foreach_cur48;
  pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> local_2c0;
  pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *local_2b0;
  auto_any_t _foreach_col48;
  ofstream of;
  directory_iterator local_a8;
  directory_iterator eod;
  directory_iterator it;
  path targetDir;
  undefined1 local_68 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  dict;
  uint32_t num_dimensions_local;
  string *dict_filename_local;
  string *data_filename_local;
  string *dir_name_local;
  
  dict._M_h._M_single_bucket._4_4_ = num_dimensions;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   *)local_68);
  bVar1 = readDictionary(dict_filename,
                         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)local_68);
  if (!bVar1) {
    dir_name_local._7_1_ = 0;
    goto LAB_0018186d;
  }
  boost::filesystem::path::path((path *)&it,dir_name);
  boost::filesystem::directory_iterator::directory_iterator(&eod,(path *)&it,none);
  boost::filesystem::directory_iterator::directory_iterator(&local_a8);
  std::ofstream::ofstream(&_foreach_col48,(string *)data_filename,_S_out);
  std::make_pair<boost::filesystem::directory_iterator&,boost::filesystem::directory_iterator&>
            ((directory_iterator *)&_foreach_cur48,&eod);
  boost::foreach_detail_::
  contain<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>>
            (&local_2c0,(true_ *)&_foreach_cur48);
  std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>::~pair
            ((pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator> *)
             &_foreach_cur48);
  local_2b0 = &local_2c0;
  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool((auto_any_base *)local_2b0);
  if (bVar1) {
LAB_001817d2:
    bVar1 = false;
  }
  else {
    boost::foreach_detail_::
    begin<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
              ((foreach_detail_ *)&_foreach_end48,(auto_any_t)local_2b0,
               (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                *)0x0,(true_ *)0x0);
    local_2d8 = (auto_any_base *)&_foreach_end48;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_2d8);
    if (bVar1) {
LAB_001817a6:
      bVar1 = false;
    }
    else {
      boost::foreach_detail_::
      end<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                ((foreach_detail_ *)&stack0xfffffffffffffd10,(auto_any_t)local_2b0,
                 (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                  *)0x0,(true_ *)0x0);
      local_2e8 = (auto_any_base *)&stack0xfffffffffffffd10;
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_2e8);
      if (!bVar1) {
        p._7_1_ = 1;
        while( true ) {
          local_614 = 0;
          if ((p._7_1_ & 1) != 0) {
            bVar1 = boost::foreach_detail_::
                    done<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                              (local_2d8,local_2e8,
                               (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                                *)0x0);
            local_614 = bVar1 ^ 0xff;
          }
          if ((local_614 & 1) == 0) break;
          bVar1 = boost::foreach_detail_::set_false((bool *)((long)&p + 7));
          if (!bVar1) {
            this = boost::foreach_detail_::
                   deref<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                             (local_2d8,
                              (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                               *)0x0);
            local_300 = boost::filesystem::directory_entry::operator_cast_to_path_(this);
            while (((p._7_1_ ^ 0xff) & 1) != 0) {
              bVar1 = boost::filesystem::is_regular_file(local_300);
              if (bVar1) {
                boost::filesystem::path::extension();
                bVar1 = boost::filesystem::operator==(&local_320,"swp");
                boost::filesystem::path::~path(&local_320);
                if (!bVar1) {
                  psVar3 = boost::filesystem::path::string_abi_cxx11_(local_300);
                  std::ifstream::ifstream((void *)((long)&line.field_2 + 8),(string *)psVar3,_S_in);
                  bVar2 = std::ios::operator!((ios *)((long)&line.field_2 +
                                                     *(long *)(line.field_2._8_8_ + -0x18) + 8));
                  if ((bVar2 & 1) == 0) {
                    std::__cxx11::string::string
                              ((string *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count);
                    std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)local_578);
                    while( true ) {
                      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                         ((istream *)(line.field_2._M_local_buf + 8),
                                          (string *)
                                          &result._M_t._M_impl.super__Rb_tree_header._M_node_count);
                      bVar1 = std::ios::operator_cast_to_bool
                                        ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
                      local_662 = 0;
                      if (bVar1) {
                        local_662 = std::__cxx11::string::empty();
                        local_662 = local_662 ^ 0xff;
                      }
                      if ((local_662 & 1) == 0) break;
                      local_590._M_cur =
                           (__node_type *)
                           std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                   *)local_68,
                                  (key_type *)
                                  &result._M_t._M_impl.super__Rb_tree_header._M_node_count);
                      std::__detail::
                      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                      ::_Node_const_iterator
                                ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                                  *)&local_588,
                                 (_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                                  *)&local_590);
                      _i = (__node_type *)
                           std::
                           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  *)local_68);
                      bVar1 = std::__detail::operator==
                                        (&local_588,
                                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                          *)&i);
                      if (!bVar1) {
                        pvVar5 = std::__detail::
                                 _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                                 ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                                               *)&local_588);
                        sVar6 = std::hash<unsigned_int>::operator()
                                          ((hash<unsigned_int> *)
                                           ((long)&it_1.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                                  ._M_cur + 7),pvVar5->second);
                        it_2._M_node._4_4_ =
                             (undefined4)(sVar6 % (ulong)dict._M_h._M_single_bucket._4_4_);
                        pmVar7 = std::
                                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                 ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                               *)local_578,(key_type *)((long)&it_2._M_node + 4));
                        *pmVar7 = *pmVar7 + 1;
                      }
                    }
                    for (it_2._M_node._0_4_ = 0;
                        (uint)it_2._M_node < dict._M_h._M_single_bucket._4_4_;
                        it_2._M_node._0_4_ = (uint)it_2._M_node + 1) {
                      local_5b0._M_node =
                           (_Base_ptr)
                           std::
                           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           ::find((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                   *)local_578,(key_type *)&it_2);
                      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::
                      _Rb_tree_const_iterator(&local_5a8,&local_5b0);
                      local_5c0._M_node =
                           (_Base_ptr)
                           std::
                           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           ::end((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                  *)local_578);
                      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::
                      _Rb_tree_const_iterator(&local_5b8,&local_5c0);
                      bVar1 = std::operator==(&local_5a8,&local_5b8);
                      if (bVar1) {
                        std::operator<<((ostream *)&_foreach_col48,"0,");
                      }
                      else {
                        ppVar8 = std::
                                 _Rb_tree_const_iterator<std::pair<const_unsigned_int,_unsigned_int>_>
                                 ::operator->(&local_5a8);
                        std::__cxx11::to_string(&local_5e0,ppVar8->second);
                        poVar9 = std::operator<<((ostream *)&_foreach_col48,(string *)&local_5e0);
                        std::operator<<(poVar9,",");
                        std::__cxx11::string::~string((string *)&local_5e0);
                      }
                    }
                    boost::filesystem::path::filename();
                    poVar9 = (ostream *)
                             boost::filesystem::operator<<
                                       ((basic_ostream<char,_std::char_traits<char>_> *)
                                        &_foreach_col48,&local_600);
                    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                    boost::filesystem::path::~path(&local_600);
                    std::
                    map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    ::~map((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)local_578);
                    std::__cxx11::string::~string
                              ((string *)&result._M_t._M_impl.super__Rb_tree_header._M_node_count);
                    bVar1 = false;
                  }
                  else {
                    poVar9 = std::operator<<((ostream *)&std::cerr,"File ");
                    psVar3 = boost::filesystem::path::string_abi_cxx11_(local_300);
                    poVar9 = std::operator<<(poVar9,(string *)psVar3);
                    poVar9 = std::operator<<(poVar9,"doesn\'t exist");
                    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
                    dir_name_local._7_1_ = 0;
                    bVar1 = true;
                  }
                  std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
                  if (bVar1) goto LAB_00181781;
                }
              }
              p._7_1_ = 1;
            }
          }
          if ((p._7_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<std::pair<boost::filesystem::directory_iterator,boost::filesystem::directory_iterator>,mpl_::bool_<true>>
                      (local_2d8,
                       (type2type<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>,_mpl_::bool_<true>_>
                        *)0x0);
          }
        }
      }
      bVar1 = false;
LAB_00181781:
      boost::foreach_detail_::auto_any<boost::filesystem::directory_iterator>::~auto_any
                ((auto_any<boost::filesystem::directory_iterator> *)&stack0xfffffffffffffd10);
      if (!bVar1) goto LAB_001817a6;
    }
    boost::foreach_detail_::auto_any<boost::filesystem::directory_iterator>::~auto_any
              ((auto_any<boost::filesystem::directory_iterator> *)&_foreach_end48);
    if (!bVar1) goto LAB_001817d2;
  }
  boost::foreach_detail_::
  auto_any<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>_>
  ::~auto_any((auto_any<std::pair<boost::filesystem::directory_iterator,_boost::filesystem::directory_iterator>_>
               *)&local_2c0);
  if (!bVar1) {
    dir_name_local._7_1_ = 1;
  }
  std::ofstream::~ofstream(&_foreach_col48);
  boost::filesystem::directory_iterator::~directory_iterator(&local_a8);
  boost::filesystem::directory_iterator::~directory_iterator(&eod);
  boost::filesystem::path::~path((path *)&it);
LAB_0018186d:
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)local_68);
  return (bool)(dir_name_local._7_1_ & 1);
}

Assistant:

bool prepareData(const std::string& dir_name, const std::string& data_filename, const std::string& dict_filename, const uint32_t num_dimensions)
    {
        std::unordered_map<std::string, uint32_t> dict;
        if (!readDictionary(dict_filename, dict))
            return false;
        
        fs::path targetDir(dir_name); 
        fs::directory_iterator it(targetDir), eod;

        std::ofstream of(data_filename);
        BOOST_FOREACH(const fs::path &p, std::make_pair(it, eod))   
        { 
            if(is_regular_file(p))
            {
                if (p.extension() == "swp")
                    continue;
                std::ifstream fi(p.string());
                if (not fi)
                {
                    std::cerr << "File " << p.string() << "doesn't exist" << std::endl;
                    return false;
                }

                std::string line;
                std::map<uint32_t, uint32_t> result;
                std::hash<uint32_t> uint32_hash;
                while (std::getline(fi, line) and !line.empty())
                {
                    const std::unordered_map<std::string, uint32_t>::const_iterator it = dict.find(line);
                    if (it == dict.end())
                        continue;
                    
                    uint32_t key = uint32_hash(it->second) % num_dimensions;
                    result[key]++;
                }
                
                for (uint32_t i = 0; i < num_dimensions; i++)
                {
                    const std::map<uint32_t, uint32_t>::const_iterator it = result.find(i);
                    if (it == result.end())
                        of << "0,";
                    else
                        of << std::to_string(it->second) << ",";    
                }
                of << p.filename() << std::endl;
            } 
        }
        return true;
    }